

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [16];
  int iVar7;
  undefined4 uVar8;
  AABBNodeMB4D *node1;
  ulong uVar9;
  RayHitK<8> *pRVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  Scene *pSVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Geometry *pGVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar102 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar112;
  undefined1 auVar111 [16];
  float fVar113;
  float fVar116;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar123;
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [16];
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RayHitK<8> local_13f9;
  ulong local_13f8;
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  size_t local_13b8;
  RayHitK<8> *local_13b0;
  Scene *local_13a8;
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  ulong local_1308;
  undefined1 (*local_1300) [16];
  long local_12f8;
  long local_12f0;
  ulong local_12e8;
  undefined1 *local_12e0;
  void *local_12d8;
  RTCRayQueryContext *local_12d0;
  RayHitK<8> *local_12c8;
  undefined1 (*local_12c0) [32];
  undefined4 local_12b8;
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  RayHitK<8> *local_1260;
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [32];
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float local_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1300 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1130._4_4_ = uVar8;
  local_1130._0_4_ = uVar8;
  local_1130._8_4_ = uVar8;
  local_1130._12_4_ = uVar8;
  auVar92 = ZEXT1664(local_1130);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1140._4_4_ = uVar8;
  local_1140._0_4_ = uVar8;
  local_1140._8_4_ = uVar8;
  local_1140._12_4_ = uVar8;
  auVar93 = ZEXT1664(local_1140);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1150._4_4_ = uVar8;
  local_1150._0_4_ = uVar8;
  local_1150._8_4_ = uVar8;
  local_1150._12_4_ = uVar8;
  auVar100 = ZEXT1664(local_1150);
  fVar113 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar117 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar123 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar101 = fVar113 * 0.99999964;
  fVar106 = fVar117 * 0.99999964;
  fVar110 = fVar123 * 0.99999964;
  fVar113 = fVar113 * 1.0000004;
  fVar117 = fVar117 * 1.0000004;
  fVar123 = fVar123 * 1.0000004;
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar30 = uVar17 ^ 0x10;
  uVar26 = local_12e8 ^ 0x10;
  uVar14 = uVar28 ^ 0x10;
  iVar7 = (tray->tnear).field_0.i[k];
  local_12b0._4_4_ = iVar7;
  local_12b0._0_4_ = iVar7;
  local_12b0._8_4_ = iVar7;
  local_12b0._12_4_ = iVar7;
  auVar85 = ZEXT1664(local_12b0);
  iVar7 = (tray->tfar).field_0.i[k];
  auVar40 = ZEXT1664(CONCAT412(iVar7,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))));
  iVar7 = 1 << ((uint)k & 0x1f);
  auVar50._4_4_ = iVar7;
  auVar50._0_4_ = iVar7;
  auVar50._8_4_ = iVar7;
  auVar50._12_4_ = iVar7;
  auVar50._16_4_ = iVar7;
  auVar50._20_4_ = iVar7;
  auVar50._24_4_ = iVar7;
  auVar50._28_4_ = iVar7;
  auVar39 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar50 = vpand_avx2(auVar50,auVar39);
  local_10e0 = vpcmpeqd_avx2(auVar50,auVar39);
  local_1160 = fVar101;
  fStack_115c = fVar101;
  fStack_1158 = fVar101;
  fStack_1154 = fVar101;
  local_1170 = fVar106;
  fStack_116c = fVar106;
  fStack_1168 = fVar106;
  fStack_1164 = fVar106;
  local_1180 = fVar110;
  fStack_117c = fVar110;
  fStack_1178 = fVar110;
  fStack_1174 = fVar110;
  local_1190 = fVar113;
  fStack_118c = fVar113;
  fStack_1188 = fVar113;
  fStack_1184 = fVar113;
  local_11a0 = fVar117;
  fStack_119c = fVar117;
  fStack_1198 = fVar117;
  fStack_1194 = fVar117;
  local_11b0 = fVar123;
  fStack_11ac = fVar123;
  fStack_11a8 = fVar123;
  fStack_11a4 = fVar123;
  fVar103 = fVar101;
  fVar104 = fVar101;
  fVar105 = fVar101;
  fVar107 = fVar106;
  fVar108 = fVar106;
  fVar109 = fVar106;
  fVar112 = fVar110;
  fVar124 = fVar110;
  fVar127 = fVar110;
  fVar129 = fVar113;
  fVar131 = fVar113;
  fVar116 = fVar113;
  fVar120 = fVar117;
  fVar121 = fVar117;
  fVar122 = fVar117;
  fVar126 = fVar123;
  fVar128 = fVar123;
  fVar130 = fVar123;
  local_13f8 = uVar17;
  local_13b8 = k;
  local_13b0 = ray;
  local_1308 = uVar28;
LAB_015f2415:
  do {
    do {
      if (local_1300 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar6 = local_1300 + -1;
      local_1300 = local_1300 + -1;
    } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar6 + 8));
    uVar27 = *(ulong *)*local_1300;
    while ((uVar27 & 8) == 0) {
      uVar9 = uVar27 & 0xfffffffffffffff0;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar41._4_4_ = uVar8;
      auVar41._0_4_ = uVar8;
      auVar41._8_4_ = uVar8;
      auVar41._12_4_ = uVar8;
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar17),auVar41,
                                *(undefined1 (*) [16])(uVar9 + 0x20 + uVar17));
      auVar37 = vsubps_avx(auVar37,auVar92._0_16_);
      auVar42._0_4_ = fVar101 * auVar37._0_4_;
      auVar42._4_4_ = fVar103 * auVar37._4_4_;
      auVar42._8_4_ = fVar104 * auVar37._8_4_;
      auVar42._12_4_ = fVar105 * auVar37._12_4_;
      auVar37 = vmaxps_avx(auVar85._0_16_,auVar42);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + local_12e8),auVar41,
                                *(undefined1 (*) [16])(uVar9 + 0x20 + local_12e8));
      auVar42 = vsubps_avx(auVar42,auVar93._0_16_);
      auVar56._0_4_ = fVar106 * auVar42._0_4_;
      auVar56._4_4_ = fVar107 * auVar42._4_4_;
      auVar56._8_4_ = fVar108 * auVar42._8_4_;
      auVar56._12_4_ = fVar109 * auVar42._12_4_;
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar28),auVar41,
                                *(undefined1 (*) [16])(uVar9 + 0x20 + uVar28));
      auVar42 = vsubps_avx(auVar42,auVar100._0_16_);
      auVar62._0_4_ = fVar110 * auVar42._0_4_;
      auVar62._4_4_ = fVar112 * auVar42._4_4_;
      auVar62._8_4_ = fVar124 * auVar42._8_4_;
      auVar62._12_4_ = fVar127 * auVar42._12_4_;
      auVar42 = vmaxps_avx(auVar56,auVar62);
      auVar37 = vmaxps_avx(auVar37,auVar42);
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar30),auVar41,
                                *(undefined1 (*) [16])(uVar9 + 0x20 + uVar30));
      auVar42 = vsubps_avx(auVar42,auVar92._0_16_);
      auVar57._0_4_ = fVar113 * auVar42._0_4_;
      auVar57._4_4_ = fVar129 * auVar42._4_4_;
      auVar57._8_4_ = fVar131 * auVar42._8_4_;
      auVar57._12_4_ = fVar116 * auVar42._12_4_;
      auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar26),auVar41,
                                *(undefined1 (*) [16])(uVar9 + 0x20 + uVar26));
      auVar42 = vminps_avx(auVar40._0_16_,auVar57);
      auVar56 = vsubps_avx(auVar56,auVar93._0_16_);
      auVar63._0_4_ = fVar117 * auVar56._0_4_;
      auVar63._4_4_ = fVar120 * auVar56._4_4_;
      auVar63._8_4_ = fVar121 * auVar56._8_4_;
      auVar63._12_4_ = fVar122 * auVar56._12_4_;
      auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar14),auVar41,
                                *(undefined1 (*) [16])(uVar9 + 0x20 + uVar14));
      auVar56 = vsubps_avx(auVar56,auVar100._0_16_);
      auVar71._0_4_ = fVar123 * auVar56._0_4_;
      auVar71._4_4_ = fVar126 * auVar56._4_4_;
      auVar71._8_4_ = fVar128 * auVar56._8_4_;
      auVar71._12_4_ = fVar130 * auVar56._12_4_;
      auVar56 = vminps_avx(auVar63,auVar71);
      auVar42 = vminps_avx(auVar42,auVar56);
      if (((uint)uVar27 & 7) == 6) {
        auVar56 = vcmpps_avx(auVar37,auVar42,2);
        auVar42 = vcmpps_avx(*(undefined1 (*) [16])(uVar9 + 0xe0),auVar41,2);
        auVar41 = vcmpps_avx(auVar41,*(undefined1 (*) [16])(uVar9 + 0xf0),1);
        auVar42 = vandps_avx(auVar42,auVar41);
        auVar42 = vandps_avx(auVar42,auVar56);
      }
      else {
        auVar42 = vcmpps_avx(auVar37,auVar42,2);
      }
      auVar42 = vpslld_avx(auVar42,0x1f);
      uVar11 = vmovmskps_avx(auVar42);
      local_10c0._0_16_ = auVar37;
      if (uVar11 == 0) goto LAB_015f2415;
      uVar11 = uVar11 & 0xff;
      lVar20 = 0;
      for (uVar27 = (ulong)uVar11; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar27 = *(ulong *)(uVar9 + lVar20 * 8);
      uVar11 = uVar11 - 1 & uVar11;
      uVar12 = (ulong)uVar11;
      if (uVar11 != 0) {
        uVar3 = *(uint *)(local_10c0 + lVar20 * 4);
        lVar20 = 0;
        for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
          lVar20 = lVar20 + 1;
        }
        uVar11 = uVar11 - 1 & uVar11;
        uVar15 = (ulong)uVar11;
        uVar12 = *(ulong *)(uVar9 + lVar20 * 8);
        uVar4 = *(uint *)(local_10c0 + lVar20 * 4);
        uVar17 = local_13f8;
        if (uVar11 == 0) {
          if (uVar3 < uVar4) {
            *(ulong *)*local_1300 = uVar12;
            *(uint *)(*local_1300 + 8) = uVar4;
            local_1300 = local_1300 + 1;
          }
          else {
            *(ulong *)*local_1300 = uVar27;
            *(uint *)(*local_1300 + 8) = uVar3;
            local_1300 = local_1300 + 1;
            uVar27 = uVar12;
          }
        }
        else {
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar27;
          auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar3));
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar12;
          auVar42 = vpunpcklqdq_avx(auVar52,ZEXT416(uVar4));
          lVar20 = 0;
          for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar11 = uVar11 - 1 & uVar11;
          uVar27 = (ulong)uVar11;
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(uVar9 + lVar20 * 8);
          auVar41 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_10c0 + lVar20 * 4)));
          auVar56 = vpcmpgtd_avx(auVar42,auVar37);
          if (uVar11 == 0) {
            auVar57 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar42,auVar37,auVar57);
            auVar37 = vblendvps_avx(auVar37,auVar42,auVar57);
            auVar42 = vpcmpgtd_avx(auVar41,auVar56);
            auVar57 = vpshufd_avx(auVar42,0xaa);
            auVar42 = vblendvps_avx(auVar41,auVar56,auVar57);
            auVar56 = vblendvps_avx(auVar56,auVar41,auVar57);
            auVar41 = vpcmpgtd_avx(auVar56,auVar37);
            auVar57 = vpshufd_avx(auVar41,0xaa);
            auVar41 = vblendvps_avx(auVar56,auVar37,auVar57);
            auVar37 = vblendvps_avx(auVar37,auVar56,auVar57);
            *local_1300 = auVar37;
            local_1300[1] = auVar41;
            uVar27 = auVar42._0_8_;
            local_1300 = local_1300 + 2;
          }
          else {
            lVar20 = 0;
            for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar20 = lVar20 + 1;
            }
            auVar72._8_8_ = 0;
            auVar72._0_8_ = *(ulong *)(uVar9 + lVar20 * 8);
            auVar62 = vpunpcklqdq_avx(auVar72,ZEXT416(*(uint *)(local_10c0 + lVar20 * 4)));
            auVar57 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar42,auVar37,auVar57);
            auVar37 = vblendvps_avx(auVar37,auVar42,auVar57);
            auVar42 = vpcmpgtd_avx(auVar62,auVar41);
            auVar57 = vpshufd_avx(auVar42,0xaa);
            auVar42 = vblendvps_avx(auVar62,auVar41,auVar57);
            auVar41 = vblendvps_avx(auVar41,auVar62,auVar57);
            auVar57 = vpcmpgtd_avx(auVar41,auVar37);
            auVar62 = vpshufd_avx(auVar57,0xaa);
            auVar57 = vblendvps_avx(auVar41,auVar37,auVar62);
            auVar37 = vblendvps_avx(auVar37,auVar41,auVar62);
            auVar41 = vpcmpgtd_avx(auVar42,auVar56);
            auVar62 = vpshufd_avx(auVar41,0xaa);
            auVar41 = vblendvps_avx(auVar42,auVar56,auVar62);
            auVar42 = vblendvps_avx(auVar56,auVar42,auVar62);
            auVar56 = vpcmpgtd_avx(auVar57,auVar42);
            auVar62 = vpshufd_avx(auVar56,0xaa);
            auVar56 = vblendvps_avx(auVar57,auVar42,auVar62);
            auVar42 = vblendvps_avx(auVar42,auVar57,auVar62);
            *local_1300 = auVar37;
            local_1300[1] = auVar42;
            local_1300[2] = auVar56;
            auVar85 = ZEXT1664(local_12b0);
            uVar27 = auVar41._0_8_;
            local_1300 = local_1300 + 3;
          }
        }
      }
    }
    local_12f8 = (ulong)((uint)uVar27 & 0xf) - 8;
    uVar27 = uVar27 & 0xfffffffffffffff0;
    for (local_12f0 = 0; local_12f0 != local_12f8; local_12f0 = local_12f0 + 1) {
      lVar29 = local_12f0 * 0x50;
      pSVar16 = context->scene;
      pGVar25 = (pSVar16->geometries).items[*(uint *)(uVar27 + 0x30 + lVar29)].ptr;
      fVar113 = (pGVar25->time_range).lower;
      fVar113 = pGVar25->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar113) /
                ((pGVar25->time_range).upper - fVar113));
      auVar37 = vroundss_avx(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),9);
      auVar37 = vminss_avx(auVar37,ZEXT416((uint)(pGVar25->fnumTimeSegments + -1.0)));
      auVar31 = vmaxss_avx(ZEXT816(0),auVar37);
      lVar13 = (long)(int)auVar31._0_4_ * 0x38;
      uVar22 = (ulong)*(uint *)(uVar27 + 4 + lVar29);
      lVar20 = *(long *)(*(long *)&pGVar25[2].numPrimitives + lVar13);
      lVar13 = *(long *)(*(long *)&pGVar25[2].numPrimitives + 0x38 + lVar13);
      auVar37 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar27 + lVar29) * 4);
      uVar9 = (ulong)*(uint *)(uVar27 + 0x10 + lVar29);
      auVar42 = *(undefined1 (*) [16])(lVar20 + uVar9 * 4);
      uVar12 = (ulong)*(uint *)(uVar27 + 0x20 + lVar29);
      auVar44 = *(undefined1 (*) [16])(lVar20 + uVar12 * 4);
      auVar56 = *(undefined1 (*) [16])(lVar20 + uVar22 * 4);
      uVar15 = (ulong)*(uint *)(uVar27 + 0x14 + lVar29);
      auVar41 = *(undefined1 (*) [16])(lVar20 + uVar15 * 4);
      uVar18 = (ulong)*(uint *)(uVar27 + 0x24 + lVar29);
      auVar45 = *(undefined1 (*) [16])(lVar20 + uVar18 * 4);
      uVar19 = (ulong)*(uint *)(uVar27 + 8 + lVar29);
      auVar57 = *(undefined1 (*) [16])(lVar20 + uVar19 * 4);
      uVar17 = (ulong)*(uint *)(uVar27 + 0x18 + lVar29);
      auVar62 = *(undefined1 (*) [16])(lVar20 + uVar17 * 4);
      uVar23 = (ulong)*(uint *)(uVar27 + 0x28 + lVar29);
      auVar63 = *(undefined1 (*) [16])(lVar20 + uVar23 * 4);
      uVar21 = (ulong)*(uint *)(uVar27 + 0xc + lVar29);
      auVar71 = *(undefined1 (*) [16])(lVar20 + uVar21 * 4);
      uVar24 = (ulong)*(uint *)(uVar27 + 0x1c + lVar29);
      auVar52 = *(undefined1 (*) [16])(lVar20 + uVar24 * 4);
      uVar28 = (ulong)*(uint *)(uVar27 + 0x2c + lVar29);
      auVar58 = *(undefined1 (*) [16])(lVar20 + uVar28 * 4);
      auVar72 = *(undefined1 (*) [16])(lVar13 + (ulong)*(uint *)(uVar27 + lVar29) * 4);
      auVar32 = *(undefined1 (*) [16])(lVar13 + uVar9 * 4);
      fVar113 = fVar113 - auVar31._0_4_;
      auVar31 = vunpcklps_avx(auVar37,auVar57);
      auVar57 = vunpckhps_avx(auVar37,auVar57);
      auVar33 = vunpcklps_avx(auVar56,auVar71);
      auVar56 = vunpckhps_avx(auVar56,auVar71);
      auVar37 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
      auVar34 = vunpcklps_avx(auVar57,auVar56);
      auVar43 = vunpcklps_avx(auVar31,auVar33);
      auVar57 = vunpckhps_avx(auVar31,auVar33);
      auVar71 = vunpcklps_avx(auVar42,auVar62);
      auVar56 = vunpckhps_avx(auVar42,auVar62);
      auVar62 = vunpcklps_avx(auVar41,auVar52);
      auVar41 = vunpckhps_avx(auVar41,auVar52);
      auVar42 = *(undefined1 (*) [16])(lVar13 + uVar19 * 4);
      auVar52 = vunpcklps_avx(auVar56,auVar41);
      auVar31 = vunpcklps_avx(auVar71,auVar62);
      auVar41 = vunpckhps_avx(auVar71,auVar62);
      auVar71 = vunpcklps_avx(auVar44,auVar63);
      auVar62 = vunpckhps_avx(auVar44,auVar63);
      auVar33 = vunpcklps_avx(auVar45,auVar58);
      auVar63 = vunpckhps_avx(auVar45,auVar58);
      auVar56 = *(undefined1 (*) [16])(lVar13 + uVar21 * 4);
      auVar58 = vunpcklps_avx(auVar62,auVar63);
      auVar44 = vunpcklps_avx(auVar71,auVar33);
      auVar62 = vunpckhps_avx(auVar71,auVar33);
      auVar63 = vunpcklps_avx(auVar72,auVar42);
      auVar42 = vunpckhps_avx(auVar72,auVar42);
      auVar71 = vunpcklps_avx(auVar37,auVar56);
      auVar56 = vunpckhps_avx(auVar37,auVar56);
      auVar37 = *(undefined1 (*) [16])(lVar13 + uVar17 * 4);
      auVar72 = vunpcklps_avx(auVar42,auVar56);
      auVar33 = vunpcklps_avx(auVar63,auVar71);
      auVar56 = vunpckhps_avx(auVar63,auVar71);
      auVar71 = vunpcklps_avx(auVar32,auVar37);
      auVar63 = vunpckhps_avx(auVar32,auVar37);
      auVar37 = *(undefined1 (*) [16])(lVar13 + uVar15 * 4);
      auVar42 = *(undefined1 (*) [16])(lVar13 + uVar24 * 4);
      auVar32 = vunpcklps_avx(auVar37,auVar42);
      auVar37 = vunpckhps_avx(auVar37,auVar42);
      auVar45 = vunpcklps_avx(auVar63,auVar37);
      auVar53 = vunpcklps_avx(auVar71,auVar32);
      auVar63 = vunpckhps_avx(auVar71,auVar32);
      auVar37 = *(undefined1 (*) [16])(lVar13 + uVar12 * 4);
      auVar42 = *(undefined1 (*) [16])(lVar13 + uVar23 * 4);
      auVar32 = vunpcklps_avx(auVar37,auVar42);
      auVar71 = vunpckhps_avx(auVar37,auVar42);
      auVar37 = *(undefined1 (*) [16])(lVar13 + uVar18 * 4);
      auVar42 = *(undefined1 (*) [16])(lVar13 + uVar28 * 4);
      auVar54 = vunpcklps_avx(auVar37,auVar42);
      auVar37 = vunpckhps_avx(auVar37,auVar42);
      auVar42 = vunpcklps_avx(auVar71,auVar37);
      auVar71 = vunpcklps_avx(auVar32,auVar54);
      auVar37 = vunpckhps_avx(auVar32,auVar54);
      fVar117 = 1.0 - fVar113;
      auVar111._4_4_ = fVar117;
      auVar111._0_4_ = fVar117;
      auVar111._8_4_ = fVar117;
      auVar111._12_4_ = fVar117;
      auVar77._0_4_ = fVar113 * auVar33._0_4_;
      auVar77._4_4_ = fVar113 * auVar33._4_4_;
      auVar77._8_4_ = fVar113 * auVar33._8_4_;
      auVar77._12_4_ = fVar113 * auVar33._12_4_;
      auVar32 = vfmadd231ps_fma(auVar77,auVar111,auVar43);
      auVar94._0_4_ = fVar113 * auVar56._0_4_;
      auVar94._4_4_ = fVar113 * auVar56._4_4_;
      auVar94._8_4_ = fVar113 * auVar56._8_4_;
      auVar94._12_4_ = fVar113 * auVar56._12_4_;
      auVar56 = vfmadd231ps_fma(auVar94,auVar111,auVar57);
      auVar86._0_4_ = fVar113 * auVar72._0_4_;
      auVar86._4_4_ = fVar113 * auVar72._4_4_;
      auVar86._8_4_ = fVar113 * auVar72._8_4_;
      auVar86._12_4_ = fVar113 * auVar72._12_4_;
      auVar57 = vfmadd231ps_fma(auVar86,auVar111,auVar34);
      auVar73._0_4_ = fVar113 * auVar53._0_4_;
      auVar73._4_4_ = fVar113 * auVar53._4_4_;
      auVar73._8_4_ = fVar113 * auVar53._8_4_;
      auVar73._12_4_ = fVar113 * auVar53._12_4_;
      auVar72 = vfmadd231ps_fma(auVar73,auVar111,auVar31);
      auVar64._0_4_ = fVar113 * auVar63._0_4_;
      auVar64._4_4_ = fVar113 * auVar63._4_4_;
      auVar64._8_4_ = fVar113 * auVar63._8_4_;
      auVar64._12_4_ = fVar113 * auVar63._12_4_;
      auVar41 = vfmadd231ps_fma(auVar64,auVar111,auVar41);
      puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar29);
      local_10f0 = *puVar1;
      uStack_10e8 = puVar1[1];
      puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar29);
      auVar43._0_4_ = fVar113 * auVar45._0_4_;
      auVar43._4_4_ = fVar113 * auVar45._4_4_;
      auVar43._8_4_ = fVar113 * auVar45._8_4_;
      auVar43._12_4_ = fVar113 * auVar45._12_4_;
      auVar63 = vfmadd231ps_fma(auVar43,auVar111,auVar52);
      auVar53._0_4_ = fVar113 * auVar71._0_4_;
      auVar53._4_4_ = fVar113 * auVar71._4_4_;
      auVar53._8_4_ = fVar113 * auVar71._8_4_;
      auVar53._12_4_ = fVar113 * auVar71._12_4_;
      auVar59._0_4_ = fVar113 * auVar37._0_4_;
      auVar59._4_4_ = fVar113 * auVar37._4_4_;
      auVar59._8_4_ = fVar113 * auVar37._8_4_;
      auVar59._12_4_ = fVar113 * auVar37._12_4_;
      auVar102._0_4_ = fVar113 * auVar42._0_4_;
      auVar102._4_4_ = fVar113 * auVar42._4_4_;
      auVar102._8_4_ = fVar113 * auVar42._8_4_;
      auVar102._12_4_ = fVar113 * auVar42._12_4_;
      auVar71 = vfmadd231ps_fma(auVar53,auVar111,auVar44);
      auVar62 = vfmadd231ps_fma(auVar59,auVar111,auVar62);
      auVar52 = vfmadd231ps_fma(auVar102,auVar111,auVar58);
      local_12a0 = *puVar1;
      uStack_1298 = puVar1[1];
      uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4);
      auVar31._4_4_ = uVar8;
      auVar31._0_4_ = uVar8;
      auVar31._8_4_ = uVar8;
      auVar31._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4 + 0x20);
      auVar114._4_4_ = uVar8;
      auVar114._0_4_ = uVar8;
      auVar114._8_4_ = uVar8;
      auVar114._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4 + 0x40);
      auVar118._4_4_ = uVar8;
      auVar118._0_4_ = uVar8;
      auVar118._8_4_ = uVar8;
      auVar118._12_4_ = uVar8;
      local_1380 = vsubps_avx(auVar32,auVar31);
      local_1320 = vsubps_avx(auVar56,auVar114);
      local_1390 = vsubps_avx(auVar57,auVar118);
      auVar37 = vsubps_avx(auVar72,auVar31);
      auVar42 = vsubps_avx(auVar41,auVar114);
      auVar56 = vsubps_avx(auVar63,auVar118);
      auVar41 = vsubps_avx(auVar71,auVar31);
      auVar57 = vsubps_avx(auVar62,auVar114);
      auVar62 = vsubps_avx(auVar52,auVar118);
      local_13a0 = vsubps_avx(auVar41,local_1380);
      local_1340 = vsubps_avx(auVar57,local_1320);
      local_1330 = vsubps_avx(auVar62,local_1390);
      auVar32._0_4_ = auVar41._0_4_ + local_1380._0_4_;
      auVar32._4_4_ = auVar41._4_4_ + local_1380._4_4_;
      auVar32._8_4_ = auVar41._8_4_ + local_1380._8_4_;
      auVar32._12_4_ = auVar41._12_4_ + local_1380._12_4_;
      auVar60._0_4_ = auVar57._0_4_ + local_1320._0_4_;
      auVar60._4_4_ = auVar57._4_4_ + local_1320._4_4_;
      auVar60._8_4_ = auVar57._8_4_ + local_1320._8_4_;
      auVar60._12_4_ = auVar57._12_4_ + local_1320._12_4_;
      fVar117 = local_1390._0_4_;
      auVar65._0_4_ = auVar62._0_4_ + fVar117;
      fVar123 = local_1390._4_4_;
      auVar65._4_4_ = auVar62._4_4_ + fVar123;
      fVar101 = local_1390._8_4_;
      auVar65._8_4_ = auVar62._8_4_ + fVar101;
      fVar106 = local_1390._12_4_;
      auVar65._12_4_ = auVar62._12_4_ + fVar106;
      auVar115._0_4_ = local_1330._0_4_ * auVar60._0_4_;
      auVar115._4_4_ = local_1330._4_4_ * auVar60._4_4_;
      auVar115._8_4_ = local_1330._8_4_ * auVar60._8_4_;
      auVar115._12_4_ = local_1330._12_4_ * auVar60._12_4_;
      auVar71 = vfmsub231ps_fma(auVar115,local_1340,auVar65);
      auVar66._0_4_ = local_13a0._0_4_ * auVar65._0_4_;
      auVar66._4_4_ = local_13a0._4_4_ * auVar65._4_4_;
      auVar66._8_4_ = local_13a0._8_4_ * auVar65._8_4_;
      auVar66._12_4_ = local_13a0._12_4_ * auVar65._12_4_;
      auVar63 = vfmsub231ps_fma(auVar66,local_1330,auVar32);
      auVar33._0_4_ = local_1340._0_4_ * auVar32._0_4_;
      auVar33._4_4_ = local_1340._4_4_ * auVar32._4_4_;
      auVar33._8_4_ = local_1340._8_4_ * auVar32._8_4_;
      auVar33._12_4_ = local_1340._12_4_ * auVar32._12_4_;
      auVar52 = vfmsub231ps_fma(auVar33,local_13a0,auVar60);
      fVar113 = *(float *)(local_13b0 + local_13b8 * 4 + 0xc0);
      auVar54._0_4_ = fVar113 * auVar52._0_4_;
      auVar54._4_4_ = fVar113 * auVar52._4_4_;
      auVar54._8_4_ = fVar113 * auVar52._8_4_;
      auVar54._12_4_ = fVar113 * auVar52._12_4_;
      uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4 + 0xa0);
      auVar95._4_4_ = uVar8;
      auVar95._0_4_ = uVar8;
      auVar95._8_4_ = uVar8;
      auVar95._12_4_ = uVar8;
      auVar63 = vfmadd231ps_fma(auVar54,auVar95,auVar63);
      uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4 + 0x80);
      auVar119._4_4_ = uVar8;
      auVar119._0_4_ = uVar8;
      auVar119._8_4_ = uVar8;
      auVar119._12_4_ = uVar8;
      local_1110 = vfmadd231ps_fma(auVar63,auVar119,auVar71);
      local_1350 = vsubps_avx(local_1320,auVar42);
      local_1100 = vsubps_avx(local_1390,auVar56);
      auVar61._0_4_ = local_1320._0_4_ + auVar42._0_4_;
      auVar61._4_4_ = local_1320._4_4_ + auVar42._4_4_;
      auVar61._8_4_ = local_1320._8_4_ + auVar42._8_4_;
      auVar61._12_4_ = local_1320._12_4_ + auVar42._12_4_;
      auVar67._0_4_ = auVar56._0_4_ + fVar117;
      auVar67._4_4_ = auVar56._4_4_ + fVar123;
      auVar67._8_4_ = auVar56._8_4_ + fVar101;
      auVar67._12_4_ = auVar56._12_4_ + fVar106;
      fVar110 = local_1100._0_4_;
      auVar78._0_4_ = auVar61._0_4_ * fVar110;
      fVar104 = local_1100._4_4_;
      auVar78._4_4_ = auVar61._4_4_ * fVar104;
      fVar107 = local_1100._8_4_;
      auVar78._8_4_ = auVar61._8_4_ * fVar107;
      fVar109 = local_1100._12_4_;
      auVar78._12_4_ = auVar61._12_4_ * fVar109;
      auVar71 = vfmsub231ps_fma(auVar78,local_1350,auVar67);
      local_1360 = vsubps_avx(local_1380,auVar37);
      fVar124 = local_1360._0_4_;
      auVar87._0_4_ = fVar124 * auVar67._0_4_;
      fVar127 = local_1360._4_4_;
      auVar87._4_4_ = fVar127 * auVar67._4_4_;
      fVar129 = local_1360._8_4_;
      auVar87._8_4_ = fVar129 * auVar67._8_4_;
      fVar131 = local_1360._12_4_;
      auVar87._12_4_ = fVar131 * auVar67._12_4_;
      auVar68._0_4_ = local_1380._0_4_ + auVar37._0_4_;
      auVar68._4_4_ = local_1380._4_4_ + auVar37._4_4_;
      auVar68._8_4_ = local_1380._8_4_ + auVar37._8_4_;
      auVar68._12_4_ = local_1380._12_4_ + auVar37._12_4_;
      auVar63 = vfmsub231ps_fma(auVar87,local_1100,auVar68);
      fVar103 = local_1350._0_4_;
      auVar69._0_4_ = auVar68._0_4_ * fVar103;
      fVar105 = local_1350._4_4_;
      auVar69._4_4_ = auVar68._4_4_ * fVar105;
      fVar108 = local_1350._8_4_;
      auVar69._8_4_ = auVar68._8_4_ * fVar108;
      fVar112 = local_1350._12_4_;
      auVar69._12_4_ = auVar68._12_4_ * fVar112;
      auVar52 = vfmsub231ps_fma(auVar69,local_1360,auVar61);
      auVar70._0_4_ = fVar113 * auVar52._0_4_;
      auVar70._4_4_ = fVar113 * auVar52._4_4_;
      auVar70._8_4_ = fVar113 * auVar52._8_4_;
      auVar70._12_4_ = fVar113 * auVar52._12_4_;
      auVar63 = vfmadd231ps_fma(auVar70,auVar95,auVar63);
      local_1280 = vfmadd231ps_fma(auVar63,auVar119,auVar71);
      auVar63 = vsubps_avx(auVar37,auVar41);
      auVar79._0_4_ = auVar41._0_4_ + auVar37._0_4_;
      auVar79._4_4_ = auVar41._4_4_ + auVar37._4_4_;
      auVar79._8_4_ = auVar41._8_4_ + auVar37._8_4_;
      auVar79._12_4_ = auVar41._12_4_ + auVar37._12_4_;
      auVar41 = vsubps_avx(auVar42,auVar57);
      auVar34._0_4_ = auVar42._0_4_ + auVar57._0_4_;
      auVar34._4_4_ = auVar42._4_4_ + auVar57._4_4_;
      auVar34._8_4_ = auVar42._8_4_ + auVar57._8_4_;
      auVar34._12_4_ = auVar42._12_4_ + auVar57._12_4_;
      auVar57 = vsubps_avx(auVar56,auVar62);
      auVar44._0_4_ = auVar56._0_4_ + auVar62._0_4_;
      auVar44._4_4_ = auVar56._4_4_ + auVar62._4_4_;
      auVar44._8_4_ = auVar56._8_4_ + auVar62._8_4_;
      auVar44._12_4_ = auVar56._12_4_ + auVar62._12_4_;
      auVar88._0_4_ = auVar34._0_4_ * auVar57._0_4_;
      auVar88._4_4_ = auVar34._4_4_ * auVar57._4_4_;
      auVar88._8_4_ = auVar34._8_4_ * auVar57._8_4_;
      auVar88._12_4_ = auVar34._12_4_ * auVar57._12_4_;
      auVar42 = vfmsub231ps_fma(auVar88,auVar41,auVar44);
      auVar45._0_4_ = auVar44._0_4_ * auVar63._0_4_;
      auVar45._4_4_ = auVar44._4_4_ * auVar63._4_4_;
      auVar45._8_4_ = auVar44._8_4_ * auVar63._8_4_;
      auVar45._12_4_ = auVar44._12_4_ * auVar63._12_4_;
      auVar37 = vfmsub231ps_fma(auVar45,auVar57,auVar79);
      auVar80._0_4_ = auVar41._0_4_ * auVar79._0_4_;
      auVar80._4_4_ = auVar41._4_4_ * auVar79._4_4_;
      auVar80._8_4_ = auVar41._8_4_ * auVar79._8_4_;
      auVar80._12_4_ = auVar41._12_4_ * auVar79._12_4_;
      auVar56 = vfmsub231ps_fma(auVar80,auVar63,auVar34);
      auVar81._0_4_ = fVar113 * auVar56._0_4_;
      auVar81._4_4_ = fVar113 * auVar56._4_4_;
      auVar81._8_4_ = fVar113 * auVar56._8_4_;
      auVar81._12_4_ = fVar113 * auVar56._12_4_;
      auVar37 = vfmadd231ps_fma(auVar81,auVar95,auVar37);
      auVar56 = vfmadd231ps_fma(auVar37,auVar119,auVar42);
      local_1290 = local_1110._0_4_;
      fStack_128c = local_1110._4_4_;
      fStack_1288 = local_1110._8_4_;
      fStack_1284 = local_1110._12_4_;
      local_1270._0_4_ = auVar56._0_4_ + local_1290 + local_1280._0_4_;
      local_1270._4_4_ = auVar56._4_4_ + fStack_128c + local_1280._4_4_;
      local_1270._8_4_ = auVar56._8_4_ + fStack_1288 + local_1280._8_4_;
      local_1270._12_4_ = auVar56._12_4_ + fStack_1284 + local_1280._12_4_;
      auVar125._8_4_ = 0x7fffffff;
      auVar125._0_8_ = 0x7fffffff7fffffff;
      auVar125._12_4_ = 0x7fffffff;
      auVar37 = vminps_avx(local_1110,local_1280);
      auVar37 = vminps_avx(auVar37,auVar56);
      local_1120 = vandps_avx(local_1270,auVar125);
      auVar96._0_4_ = local_1120._0_4_ * 1.1920929e-07;
      auVar96._4_4_ = local_1120._4_4_ * 1.1920929e-07;
      auVar96._8_4_ = local_1120._8_4_ * 1.1920929e-07;
      auVar96._12_4_ = local_1120._12_4_ * 1.1920929e-07;
      uVar17 = CONCAT44(auVar96._4_4_,auVar96._0_4_);
      auVar89._0_8_ = uVar17 ^ 0x8000000080000000;
      auVar89._8_4_ = -auVar96._8_4_;
      auVar89._12_4_ = -auVar96._12_4_;
      auVar37 = vcmpps_avx(auVar37,auVar89,5);
      auVar42 = vmaxps_avx(local_1110,local_1280);
      auVar42 = vmaxps_avx(auVar42,auVar56);
      auVar42 = vcmpps_avx(auVar42,auVar96,2);
      local_13f0 = vorps_avx(auVar37,auVar42);
      k = local_13b8;
      ray = local_13b0;
      if ((((local_13f0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (local_13f0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (local_13f0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          local_13f0[0xf] < '\0') {
        auVar46._0_4_ = fVar103 * local_1330._0_4_;
        auVar46._4_4_ = fVar105 * local_1330._4_4_;
        auVar46._8_4_ = fVar108 * local_1330._8_4_;
        auVar46._12_4_ = fVar112 * local_1330._12_4_;
        auVar82._0_4_ = fVar124 * local_1340._0_4_;
        auVar82._4_4_ = fVar127 * local_1340._4_4_;
        auVar82._8_4_ = fVar129 * local_1340._8_4_;
        auVar82._12_4_ = fVar131 * local_1340._12_4_;
        auVar56 = vfmsub213ps_fma(local_1340,local_1100,auVar46);
        auVar90._0_4_ = auVar41._0_4_ * fVar110;
        auVar90._4_4_ = auVar41._4_4_ * fVar104;
        auVar90._8_4_ = auVar41._8_4_ * fVar107;
        auVar90._12_4_ = auVar41._12_4_ * fVar109;
        auVar97._0_4_ = fVar124 * auVar57._0_4_;
        auVar97._4_4_ = fVar127 * auVar57._4_4_;
        auVar97._8_4_ = fVar129 * auVar57._8_4_;
        auVar97._12_4_ = fVar131 * auVar57._12_4_;
        auVar57 = vfmsub213ps_fma(auVar57,local_1350,auVar90);
        auVar37 = vandps_avx(auVar125,auVar46);
        auVar42 = vandps_avx(auVar125,auVar90);
        auVar37 = vcmpps_avx(auVar37,auVar42,1);
        local_1210 = vblendvps_avx(auVar57,auVar56,auVar37);
        auVar74._0_4_ = fVar103 * auVar63._0_4_;
        auVar74._4_4_ = fVar105 * auVar63._4_4_;
        auVar74._8_4_ = fVar108 * auVar63._8_4_;
        auVar74._12_4_ = fVar112 * auVar63._12_4_;
        auVar56 = vfmsub213ps_fma(auVar63,local_1100,auVar97);
        auVar91._0_4_ = local_13a0._0_4_ * fVar110;
        auVar91._4_4_ = local_13a0._4_4_ * fVar104;
        auVar91._8_4_ = local_13a0._8_4_ * fVar107;
        auVar91._12_4_ = local_13a0._12_4_ * fVar109;
        auVar57 = vfmsub213ps_fma(local_1330,local_1360,auVar91);
        auVar37 = vandps_avx(auVar125,auVar91);
        auVar42 = vandps_avx(auVar97,auVar125);
        auVar37 = vcmpps_avx(auVar37,auVar42,1);
        local_1200 = vblendvps_avx(auVar56,auVar57,auVar37);
        auVar56 = vfmsub213ps_fma(local_13a0,local_1350,auVar82);
        auVar41 = vfmsub213ps_fma(auVar41,local_1360,auVar74);
        auVar37 = vandps_avx(auVar125,auVar82);
        auVar42 = vandps_avx(auVar125,auVar74);
        auVar37 = vcmpps_avx(auVar37,auVar42,1);
        local_11f0 = vblendvps_avx(auVar41,auVar56,auVar37);
        auVar75._0_4_ = local_11f0._0_4_ * fVar113;
        auVar75._4_4_ = local_11f0._4_4_ * fVar113;
        auVar75._8_4_ = local_11f0._8_4_ * fVar113;
        auVar75._12_4_ = local_11f0._12_4_ * fVar113;
        auVar37 = vfmadd213ps_fma(auVar95,local_1200,auVar75);
        auVar37 = vfmadd213ps_fma(auVar119,local_1210,auVar37);
        auVar76._0_4_ = auVar37._0_4_ + auVar37._0_4_;
        auVar76._4_4_ = auVar37._4_4_ + auVar37._4_4_;
        auVar76._8_4_ = auVar37._8_4_ + auVar37._8_4_;
        auVar76._12_4_ = auVar37._12_4_ + auVar37._12_4_;
        auVar83._0_4_ = local_11f0._0_4_ * fVar117;
        auVar83._4_4_ = local_11f0._4_4_ * fVar123;
        auVar83._8_4_ = local_11f0._8_4_ * fVar101;
        auVar83._12_4_ = local_11f0._12_4_ * fVar106;
        auVar37 = vfmadd213ps_fma(local_1320,local_1200,auVar83);
        auVar42 = vfmadd213ps_fma(local_1380,local_1210,auVar37);
        auVar37 = vrcpps_avx(auVar76);
        auVar98._8_4_ = 0x3f800000;
        auVar98._0_8_ = 0x3f8000003f800000;
        auVar98._12_4_ = 0x3f800000;
        auVar56 = vfnmadd213ps_fma(auVar37,auVar76,auVar98);
        auVar37 = vfmadd132ps_fma(auVar56,auVar37,auVar37);
        local_1220._0_4_ = auVar37._0_4_ * (auVar42._0_4_ + auVar42._0_4_);
        local_1220._4_4_ = auVar37._4_4_ * (auVar42._4_4_ + auVar42._4_4_);
        local_1220._8_4_ = auVar37._8_4_ * (auVar42._8_4_ + auVar42._8_4_);
        local_1220._12_4_ = auVar37._12_4_ * (auVar42._12_4_ + auVar42._12_4_);
        auVar40 = ZEXT1664(local_1220);
        uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4 + 0x60);
        auVar84._4_4_ = uVar8;
        auVar84._0_4_ = uVar8;
        auVar84._8_4_ = uVar8;
        auVar84._12_4_ = uVar8;
        auVar37 = vcmpps_avx(auVar84,local_1220,2);
        uVar8 = *(undefined4 *)(local_13b0 + local_13b8 * 4 + 0x100);
        auVar99._4_4_ = uVar8;
        auVar99._0_4_ = uVar8;
        auVar99._8_4_ = uVar8;
        auVar99._12_4_ = uVar8;
        auVar85 = ZEXT1664(auVar99);
        auVar42 = vcmpps_avx(local_1220,auVar99,2);
        auVar37 = vandps_avx(auVar37,auVar42);
        auVar56 = local_13f0 & auVar37;
        if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar56[0xf] < '\0') {
          auVar37 = vandps_avx(auVar37,local_13f0);
          auVar56 = vcmpps_avx(auVar76,_DAT_01f45a50,4);
          auVar41 = auVar56 & auVar37;
          if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar41[0xf] < '\0') {
            local_1370 = vandps_avx(auVar37,auVar56);
            pRVar10 = &local_13f9;
            local_1260 = pRVar10;
            local_1250 = local_1370;
            auVar37 = vrcpps_avx(local_1270);
            auVar55._8_4_ = 0x3f800000;
            auVar55._0_8_ = 0x3f8000003f800000;
            auVar55._12_4_ = 0x3f800000;
            auVar56 = vfnmadd213ps_fma(local_1270,auVar37,auVar55);
            auVar56 = vfmadd132ps_fma(auVar56,auVar37,auVar37);
            auVar47._8_4_ = 0x219392ef;
            auVar47._0_8_ = 0x219392ef219392ef;
            auVar47._12_4_ = 0x219392ef;
            auVar37 = vcmpps_avx(local_1120,auVar47,5);
            auVar37 = vandps_avx(auVar56,auVar37);
            auVar35._0_4_ = local_1290 * auVar37._0_4_;
            auVar35._4_4_ = fStack_128c * auVar37._4_4_;
            auVar35._8_4_ = fStack_1288 * auVar37._8_4_;
            auVar35._12_4_ = fStack_1284 * auVar37._12_4_;
            local_1240 = vminps_avx(auVar35,auVar55);
            auVar36._0_4_ = auVar37._0_4_ * local_1280._0_4_;
            auVar36._4_4_ = auVar37._4_4_ * local_1280._4_4_;
            auVar36._8_4_ = auVar37._8_4_ * local_1280._8_4_;
            auVar36._12_4_ = auVar37._12_4_ * local_1280._12_4_;
            local_1230 = vminps_avx(auVar36,auVar55);
            auVar48._8_4_ = 0x7f800000;
            auVar48._0_8_ = 0x7f8000007f800000;
            auVar48._12_4_ = 0x7f800000;
            auVar37 = vblendvps_avx(auVar48,local_1220,local_1370);
            auVar56 = vshufps_avx(auVar37,auVar37,0xb1);
            auVar56 = vminps_avx(auVar56,auVar37);
            auVar41 = vshufpd_avx(auVar56,auVar56,1);
            auVar56 = vminps_avx(auVar41,auVar56);
            auVar37 = vcmpps_avx(auVar37,auVar56,0);
            auVar41 = local_1370 & auVar37;
            auVar56 = vpcmpeqd_avx(auVar56,auVar56);
            if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar41[0xf] < '\0') {
              auVar56 = auVar37;
            }
            auVar37 = vandps_avx(local_1370,auVar56);
            auVar50 = vpcmpeqd_avx2(ZEXT1632(auVar42),ZEXT1632(auVar42));
            auVar92 = ZEXT3264(auVar50);
            local_13a8 = pSVar16;
            do {
              auVar37 = vpslld_avx(auVar37,0x1f);
              uVar8 = vmovmskps_avx(auVar37);
              lVar20 = 0;
              for (uVar17 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar8); (uVar17 & 1) == 0;
                  uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar11 = *(uint *)((long)&local_10f0 + lVar20 * 4);
              pRVar10 = (RayHitK<8> *)(ulong)uVar11;
              pGVar25 = (pSVar16->geometries).items[(long)pRVar10].ptr;
              if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1370 + lVar20 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar17 = (ulong)(uint)((int)lVar20 << 2);
                  uVar8 = *(undefined4 *)(local_1240 + uVar17);
                  uVar2 = *(undefined4 *)(local_1230 + uVar17);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + uVar17);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1210 + uVar17);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1200 + uVar17);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11f0 + uVar17);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar8;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_12a0 + uVar17)
                  ;
                  *(uint *)(ray + k * 4 + 0x240) = uVar11;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                uVar17 = (ulong)(uint)((int)lVar20 * 4);
                local_1060 = *(undefined4 *)(local_1240 + uVar17);
                local_1040 = *(undefined4 *)(local_1230 + uVar17);
                uVar8 = *(undefined4 *)((long)&local_12a0 + uVar17);
                local_1020._4_4_ = uVar8;
                local_1020._0_4_ = uVar8;
                local_1020._8_4_ = uVar8;
                local_1020._12_4_ = uVar8;
                local_1020._16_4_ = uVar8;
                local_1020._20_4_ = uVar8;
                local_1020._24_4_ = uVar8;
                local_1020._28_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_1210 + uVar17);
                local_10c0._4_4_ = uVar8;
                local_10c0._0_4_ = uVar8;
                local_10c0._8_4_ = uVar8;
                local_10c0._12_4_ = uVar8;
                local_10c0._16_4_ = uVar8;
                local_10c0._20_4_ = uVar8;
                local_10c0._24_4_ = uVar8;
                local_10c0._28_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_1200 + uVar17);
                local_10a0._4_4_ = uVar8;
                local_10a0._0_4_ = uVar8;
                local_10a0._8_4_ = uVar8;
                local_10a0._12_4_ = uVar8;
                local_10a0._16_4_ = uVar8;
                local_10a0._20_4_ = uVar8;
                local_10a0._24_4_ = uVar8;
                local_10a0._28_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_11f0 + uVar17);
                local_1080._4_4_ = uVar8;
                local_1080._0_4_ = uVar8;
                local_1080._8_4_ = uVar8;
                local_1080._12_4_ = uVar8;
                local_1080._16_4_ = uVar8;
                local_1080._20_4_ = uVar8;
                local_1080._24_4_ = uVar8;
                local_1080._28_4_ = uVar8;
                local_1000._4_4_ = uVar11;
                local_1000._0_4_ = uVar11;
                local_1000._8_4_ = uVar11;
                local_1000._12_4_ = uVar11;
                local_1000._16_4_ = uVar11;
                local_1000._20_4_ = uVar11;
                local_1000._24_4_ = uVar11;
                local_1000._28_4_ = uVar11;
                uStack_105c = local_1060;
                uStack_1058 = local_1060;
                uStack_1054 = local_1060;
                uStack_1050 = local_1060;
                uStack_104c = local_1060;
                uStack_1048 = local_1060;
                uStack_1044 = local_1060;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + uVar17);
                local_11e0 = local_10e0;
                local_12e0 = local_11e0;
                local_12d8 = pGVar25->userPtr;
                local_12d0 = context->user;
                local_12c0 = &local_10c0;
                local_12b8 = 8;
                pRVar10 = (RayHitK<8> *)pGVar25->intersectionFilterN;
                local_12c8 = ray;
                if (pRVar10 != (RayHitK<8> *)0x0) {
                  local_13f0._0_8_ = lVar20;
                  local_13d0 = auVar40._0_16_;
                  local_13e0 = auVar85._0_16_;
                  local_1380._0_8_ = pGVar25;
                  auVar50 = ZEXT1632(auVar92._0_16_);
                  pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_12e0);
                  auVar85 = ZEXT1664(local_13e0);
                  auVar40 = ZEXT1664(local_13d0);
                  auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                  auVar92 = ZEXT3264(auVar50);
                  pSVar16 = local_13a8;
                  lVar20 = local_13f0._0_8_;
                  k = local_13b8;
                  ray = local_13b0;
                  pGVar25 = (Geometry *)local_1380._0_8_;
                }
                auVar39 = vpcmpeqd_avx2(local_11e0,_DAT_01f7b000);
                auVar50 = auVar92._0_32_ & ~auVar39;
                if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar50 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar50 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar50 >> 0x7f,0) == '\0') &&
                      (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar50 >> 0xbf,0) == '\0') &&
                    (auVar50 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar50[0x1f]) {
                  auVar39 = auVar39 ^ auVar92._0_32_;
                }
                else {
                  pRVar10 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar10 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar25->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_13f0._0_8_ = lVar20;
                    local_13d0 = auVar40._0_16_;
                    local_13e0 = auVar85._0_16_;
                    auVar50 = ZEXT1632(auVar92._0_16_);
                    pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_12e0);
                    auVar85 = ZEXT1664(local_13e0);
                    auVar40 = ZEXT1664(local_13d0);
                    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                    auVar92 = ZEXT3264(auVar50);
                    pSVar16 = local_13a8;
                    lVar20 = local_13f0._0_8_;
                    k = local_13b8;
                    ray = local_13b0;
                  }
                  auVar5 = vpcmpeqd_avx2(local_11e0,_DAT_01f7b000);
                  auVar39 = auVar5 ^ auVar92._0_32_;
                  auVar50 = auVar92._0_32_ & ~auVar5;
                  if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar50 >> 0x7f,0) != '\0') ||
                        (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar50 >> 0xbf,0) != '\0') ||
                      (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar50[0x1f] < '\0') {
                    auVar51._0_4_ = auVar5._0_4_ ^ auVar92._0_4_;
                    auVar51._4_4_ = auVar5._4_4_ ^ auVar92._4_4_;
                    auVar51._8_4_ = auVar5._8_4_ ^ auVar92._8_4_;
                    auVar51._12_4_ = auVar5._12_4_ ^ auVar92._12_4_;
                    auVar51._16_4_ = auVar5._16_4_ ^ auVar92._16_4_;
                    auVar51._20_4_ = auVar5._20_4_ ^ auVar92._20_4_;
                    auVar51._24_4_ = auVar5._24_4_ ^ auVar92._24_4_;
                    auVar51._28_4_ = auVar5._28_4_ ^ auVar92._28_4_;
                    auVar50 = vmaskmovps_avx(auVar51,*local_12c0);
                    *(undefined1 (*) [32])(local_12c8 + 0x180) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar51,local_12c0[1]);
                    *(undefined1 (*) [32])(local_12c8 + 0x1a0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar51,local_12c0[2]);
                    *(undefined1 (*) [32])(local_12c8 + 0x1c0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar51,local_12c0[3]);
                    *(undefined1 (*) [32])(local_12c8 + 0x1e0) = auVar50;
                    auVar50 = vmaskmovps_avx(auVar51,local_12c0[4]);
                    *(undefined1 (*) [32])(local_12c8 + 0x200) = auVar50;
                    auVar50 = vpmaskmovd_avx2(auVar51,local_12c0[5]);
                    *(undefined1 (*) [32])(local_12c8 + 0x220) = auVar50;
                    auVar50 = vpmaskmovd_avx2(auVar51,local_12c0[6]);
                    *(undefined1 (*) [32])(local_12c8 + 0x240) = auVar50;
                    auVar50 = vpmaskmovd_avx2(auVar51,local_12c0[7]);
                    *(undefined1 (*) [32])(local_12c8 + 0x260) = auVar50;
                    auVar50 = vpmaskmovd_avx2(auVar51,local_12c0[8]);
                    *(undefined1 (*) [32])(local_12c8 + 0x280) = auVar50;
                    pRVar10 = local_12c8;
                  }
                }
                if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar39 >> 0x7f,0) == '\0') &&
                      (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar39 >> 0xbf,0) == '\0') &&
                    (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar39[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar85._0_4_;
                }
                else {
                  auVar85 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_1370 + lVar20 * 4) = 0;
                uVar8 = auVar85._0_4_;
                auVar38._4_4_ = uVar8;
                auVar38._0_4_ = uVar8;
                auVar38._8_4_ = uVar8;
                auVar38._12_4_ = uVar8;
                auVar37 = vcmpps_avx(auVar40._0_16_,auVar38,2);
                local_1370 = vandps_avx(auVar37,local_1370);
              }
              if ((((local_1370 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1370 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1370 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1370[0xf]) break;
              auVar49._8_4_ = 0x7f800000;
              auVar49._0_8_ = 0x7f8000007f800000;
              auVar49._12_4_ = 0x7f800000;
              auVar37 = vblendvps_avx(auVar49,auVar40._0_16_,local_1370);
              auVar42 = vshufps_avx(auVar37,auVar37,0xb1);
              auVar42 = vminps_avx(auVar42,auVar37);
              auVar56 = vshufpd_avx(auVar42,auVar42,1);
              auVar42 = vminps_avx(auVar56,auVar42);
              auVar42 = vcmpps_avx(auVar37,auVar42,0);
              auVar56 = local_1370 & auVar42;
              auVar37 = local_1370;
              if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar56 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar56[0xf] < '\0') {
                auVar37 = vandps_avx(auVar42,local_1370);
              }
              auVar37 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar37);
            } while( true );
          }
        }
      }
      auVar92 = ZEXT1664(local_1130);
      auVar93 = ZEXT1664(local_1140);
      auVar100 = ZEXT1664(local_1150);
      auVar85 = ZEXT1664(local_12b0);
      uVar17 = local_13f8;
      uVar28 = local_1308;
      fVar101 = local_1160;
      fVar103 = fStack_115c;
      fVar104 = fStack_1158;
      fVar105 = fStack_1154;
      fVar106 = local_1170;
      fVar107 = fStack_116c;
      fVar108 = fStack_1168;
      fVar109 = fStack_1164;
      fVar110 = local_1180;
      fVar112 = fStack_117c;
      fVar124 = fStack_1178;
      fVar127 = fStack_1174;
      fVar113 = local_1190;
      fVar129 = fStack_118c;
      fVar131 = fStack_1188;
      fVar116 = fStack_1184;
      fVar117 = local_11a0;
      fVar120 = fStack_119c;
      fVar121 = fStack_1198;
      fVar122 = fStack_1194;
      fVar123 = local_11b0;
      fVar126 = fStack_11ac;
      fVar128 = fStack_11a8;
      fVar130 = fStack_11a4;
    }
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar40 = ZEXT1664(CONCAT412(uVar8,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }